

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_vert
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,MACROBLOCKD_PLANE *plane_ptr,
               uint32_t mi_row,uint32_t mi_col)

{
  byte bVar1;
  byte bVar2;
  int dst_stride;
  uint8_t *puVar3;
  byte bVar4;
  ulong uVar5;
  int x;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *dst;
  AV1_DEBLOCKING_PARAMETERS params;
  
  bVar1 = (byte)plane_ptr->subsampling_y;
  bVar2 = (byte)plane_ptr->subsampling_x;
  uVar8 = (((1 << (bVar1 & 0x1f)) >> 1) + (cm->mi_params).mi_rows >> (bVar1 & 0x1f)) -
          (mi_row >> (bVar1 & 0x1f));
  uVar9 = 0x20 >> (bVar1 & 0x1f);
  if ((int)uVar8 < (int)uVar9) {
    uVar9 = uVar8;
  }
  uVar7 = (((1 << (bVar2 & 0x1f)) >> 1) + (cm->mi_params).mi_cols >> (bVar2 & 0x1f)) -
          (mi_col >> (bVar2 & 0x1f));
  uVar8 = 0x20 >> (bVar2 & 0x1f);
  if ((int)uVar7 < (int)uVar8) {
    uVar8 = uVar7;
  }
  puVar3 = (plane_ptr->dst).buf;
  uVar5 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar5;
  }
  dst_stride = (plane_ptr->dst).stride;
  for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    dst = puVar3 + uVar5 * 4 * (long)dst_stride;
    for (iVar6 = 0; iVar6 < (int)uVar8; iVar6 = iVar6 + tx_size_wide_unit[bVar4]) {
      params.filter_length = '\0';
      params._1_7_ = 0;
      params.lfthr = (loop_filter_thresh *)0x0;
      bVar4 = set_lpf_parameters(&params,1L << (bVar2 & 0x3f),cm,xd,'\0',
                                 ((mi_col << 2) >> (bVar2 & 0x1f)) + iVar6 * 4,
                                 (int)(uVar5 * 4) + ((mi_row << 2) >> (bVar1 & 0x1f)),plane,
                                 plane_ptr);
      if (bVar4 == 0xff) {
        params._0_8_ = params._0_8_ & 0xffffffffffffff00;
        bVar4 = 0;
      }
      filter_vert(dst,dst_stride,&params,cm->seq_params,'\0');
      dst = dst + (uint)(tx_size_wide_unit[bVar4] << 2);
    }
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert(const AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, const int plane,
                                 const MACROBLOCKD_PLANE *const plane_ptr,
                                 const uint32_t mi_row, const uint32_t mi_col) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  const int plane_mi_rows =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_rows, scale_vert);
  const int plane_mi_cols =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, scale_horz);
  const int y_range = AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
                             (MAX_MIB_SIZE >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));

  for (int y = 0; y < y_range; y++) {
    uint8_t *p = dst_ptr + y * MI_SIZE * dst_stride;
    for (int x = 0; x < x_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will filter the vertical edge aligned with a 8x8 block.
      // If 4x4 transform is used, it will then filter the internal edge
      //  aligned with a 4x4 block
      const uint32_t curr_x = ((mi_col * MI_SIZE) >> scale_horz) + x * MI_SIZE;
      const uint32_t curr_y = ((mi_row * MI_SIZE) >> scale_vert) + y * MI_SIZE;
      uint32_t advance_units;
      TX_SIZE tx_size;
      AV1_DEBLOCKING_PARAMETERS params;
      memset(&params, 0, sizeof(params));

      tx_size =
          set_lpf_parameters(&params, ((ptrdiff_t)1 << scale_horz), cm, xd,
                             VERT_EDGE, curr_x, curr_y, plane, plane_ptr);
      if (tx_size == TX_INVALID) {
        params.filter_length = 0;
        tx_size = TX_4X4;
      }

      filter_vert(p, dst_stride, &params, cm->seq_params, USE_SINGLE);

      // advance the destination pointer
      advance_units = tx_size_wide_unit[tx_size];
      x += advance_units;
      p += advance_units * MI_SIZE;
    }
  }
}